

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O3

int buffer_ready_for_writing(trico_archive *arch,uint64_t bytes_needed)

{
  uint8_t *__ptr;
  uint8_t *puVar1;
  uint8_t *puVar2;
  uint64_t extra_size;
  long lVar3;
  int iVar4;
  
  iVar4 = 0;
  if (arch->writable != 0) {
    lVar3 = bytes_needed - arch->size_available;
    if (arch->size_available <= bytes_needed && lVar3 != 0) {
      __ptr = arch->buffer;
      puVar1 = arch->buffer_pointer;
      puVar2 = (uint8_t *)realloc(__ptr,arch->buffer_size + lVar3);
      arch->buffer = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        return 0;
      }
      arch->buffer_pointer = puVar2 + ((long)puVar1 - (long)__ptr);
      arch->buffer_size = arch->buffer_size + lVar3;
      arch->size_available = arch->size_available + lVar3;
    }
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int buffer_ready_for_writing(struct trico_archive* arch, uint64_t bytes_needed)
  {
  if (!arch->writable)
    return 0;
  if (sufficient_buffer_available(arch, bytes_needed) == 0)
    {
    uint64_t extra_size = bytes_needed - arch->size_available;
    uint64_t buff_diff = arch->buffer_pointer - arch->buffer;
    arch->buffer = (uint8_t*)trico_realloc(arch->buffer, arch->buffer_size + extra_size);
    if (arch->buffer == NULL)
      return 0;
    arch->buffer_pointer = arch->buffer + buff_diff;
    arch->buffer_size += extra_size;
    arch->size_available += extra_size;
    }
  return 1;
  }